

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

bool __thiscall
fasttext::FastText::predictLine
          (FastText *this,istream *in,
          vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *predictions)

{
  bool bVar1;
  int iVar2;
  reference ppVar3;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_RDX;
  size_type in_RDI;
  double dVar4;
  pair<float,_int> *p;
  iterator __end1;
  iterator __begin1;
  Predictions *__range1;
  Predictions linePredictions;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> words;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *__args;
  vector<int,_std::allocator<int>_> *this_00;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff40;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_88;
  undefined1 *local_80;
  pointer in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int32_t in_stack_ffffffffffffff94;
  Dictionary *in_stack_ffffffffffffff98;
  Dictionary *in_stack_ffffffffffffffa0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  FastText *in_stack_ffffffffffffffb0;
  bool local_1;
  
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x171b79);
  iVar2 = std::istream::peek();
  if (iVar2 == -1) {
    local_1 = false;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x171baa);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x171bbc);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x171bca);
    Dictionary::getLine(in_stack_ffffffffffffffa0,(istream *)in_stack_ffffffffffffff98,
                        (vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff88);
    this_00 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff88;
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)0x171bf8);
    predict(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
            (Predictions *)in_stack_ffffffffffffffa0);
    __args = in_RDX;
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
               &stack0xffffffffffffff88);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::reserve(in_stack_ffffffffffffff40,in_RDI);
    local_80 = &stack0xffffffffffffff88;
    local_88._M_current =
         (pair<float,_int> *)
         std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                   (in_stack_ffffffffffffff08);
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
              (in_stack_ffffffffffffff08);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          *)in_stack_ffffffffffffff08);
      if (!bVar1) break;
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
               ::operator*(&local_88);
      in_stack_ffffffffffffff08 = in_RDX;
      dVar4 = std::exp((double)(ulong)(uint)ppVar3->first);
      in_stack_ffffffffffffff14 = SUB84(dVar4,0);
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x171cc8);
      Dictionary::getLabel_abi_cxx11_(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      std::
      vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
      ::emplace_back<float,std::__cxx11::string>
                ((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_00,(float *)__args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
      __gnu_cxx::
      __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
      ::operator++(&local_88);
    }
    local_1 = true;
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~vector
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)this_00);
    std::vector<int,_std::allocator<int>_>::~vector(this_00);
    std::vector<int,_std::allocator<int>_>::~vector(this_00);
  }
  return local_1;
}

Assistant:

bool FastText::predictLine(std::istream& in, std::vector<std::pair<real, std::string>>& predictions) const {
  predictions.clear();
  if (in.peek() == EOF) {
    return false;
  }

  std::vector<int32_t> words, labels;
  dict_->getLine(in, words, labels);
  Predictions linePredictions;
  predict(words, linePredictions);
  predictions.reserve(linePredictions.size());
  for (const auto& p : linePredictions) {
    predictions.emplace_back(std::exp(p.first), dict_->getLabel(p.second));
  }

  return true;
}